

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.hpp
# Opt level: O3

ostream * detail::operator<<(ostream *os,print_bytes<unsigned_long> *s)

{
  uint uVar1;
  undefined8 uVar2;
  char *__s;
  ostream *poVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  char local_19;
  
  uVar7 = s->value;
  if (uVar7 < 0x400) {
    fVar10 = 0.0;
    uVar8 = 0;
  }
  else {
    uVar5 = 0;
    do {
      uVar6 = uVar7;
      uVar7 = uVar6 >> 10;
      uVar8 = uVar5 + 1;
      if (uVar6 < 0x100000) break;
      bVar9 = uVar5 < 7;
      uVar5 = uVar8;
    } while (bVar9);
    fVar10 = (float)((uint)uVar6 & 0x3ff) * 0.0009765625;
  }
  uVar1 = s->precision;
  if ((uVar7 < 100 || 3 < (int)uVar1) && (1 < (int)uVar1 && (2 < (int)uVar1 || uVar7 < 10))) {
    uVar2 = *(undefined8 *)(&os->field_0x8 + (long)os->_vptr_basic_ostream[-3]);
    *(ulong *)(&os->field_0x8 + (long)os->_vptr_basic_ostream[-3]) = (ulong)uVar1;
    std::ostream::_M_insert<double>((double)(fVar10 + (float)(long)uVar7));
    *(undefined8 *)(&os->field_0x8 + (long)os->_vptr_basic_ostream[-3]) = uVar2;
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  local_19 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_19,1);
  __s = byte_size_units[uVar8];
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  return poVar3;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const print_bytes<T> & s) {
	
	size_t frac = size_t(1024 * (s.value - T(boost::uint64_t(s.value))));
	boost::uint64_t whole = boost::uint64_t(s.value);
	
	size_t i = 0;
	
	while(whole >= 1024 && i < size_t(boost::size(byte_size_units)) - 1) {
		frac = whole % 1024, whole /= 1024;
		i++;
	}
	
	if((whole >= 100 && s.precision <= 3) || (whole >= 10 && s.precision <= 2) || s.precision <= 1) {
		os << whole;
	} else {
		float num = float(whole) + (float(frac) / 1024.f);
		std::streamsize old_precision = os.precision(s.precision);
		os << num;
		os.precision(old_precision);
	}
	
	return os << ' ' << byte_size_units[i];
}